

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getRCPrototypes(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  RDL_cycle **ppRVar4;
  RDL_cycle *pRVar5;
  RDL_edge *paRVar6;
  uint local_54;
  uint mapped_edge;
  uint bcc_index;
  char *prototype;
  uint k;
  uint j;
  uint i;
  uint currEdge;
  uint currFam;
  uint rcf;
  uint nofRel;
  uint nof_urf;
  RDL_cycle **result;
  RDL_cycle ***ptr_local;
  RDL_data *data_local;
  
  currFam = 0;
  currEdge = 0;
  i = 0;
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar4 = (RDL_cycle **)malloc(8);
    *ptr = ppRVar4;
    data_local._4_4_ = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar4 = (RDL_cycle **)malloc(8);
    *ptr = ppRVar4;
    data_local._4_4_ = 0;
  }
  else {
    for (k = 0; k < data->bccGraphs->nof_bcc; k = k + 1) {
      for (prototype._4_4_ = 0; prototype._4_4_ < data->nofURFsPerBCC[k];
          prototype._4_4_ = prototype._4_4_ + 1) {
        currFam = data->urfInfoPerBCC[k]->nofCFsPerURF[prototype._4_4_] + currFam;
      }
    }
    ppRVar4 = (RDL_cycle **)malloc((ulong)currFam << 3);
    for (local_54 = 0; local_54 < data->bccGraphs->nof_bcc; local_54 = local_54 + 1) {
      uVar1 = data->nofURFsPerBCC[local_54];
      for (k = 0; k < uVar1; k = k + 1) {
        for (prototype._4_4_ = 0; prototype._4_4_ < data->urfInfoPerBCC[local_54]->nofCFsPerURF[k];
            prototype._4_4_ = prototype._4_4_ + 1) {
          pcVar3 = data->urfInfoPerBCC[local_54]->URFs[k][prototype._4_4_]->prototype;
          pRVar5 = (RDL_cycle *)malloc(0x18);
          ppRVar4[i] = pRVar5;
          paRVar6 = (RDL_edge *)
                    malloc((ulong)data->urfInfoPerBCC[local_54]->URFs[k][prototype._4_4_]->weight <<
                           3);
          ppRVar4[i]->edges = paRVar6;
          ppRVar4[i]->weight = data->urfInfoPerBCC[local_54]->URFs[k][prototype._4_4_]->weight;
          ppRVar4[i]->urf = k;
          ppRVar4[i]->rcf = currEdge;
          j = 0;
          for (prototype._0_4_ = 0; (uint)prototype < data->bccGraphs->bcc_graphs[local_54]->E;
              prototype._0_4_ = (uint)prototype + 1) {
            if (pcVar3[(uint)prototype] == '\x01') {
              uVar2 = data->bccGraphs->edge_from_bcc_mapping[local_54][(uint)prototype];
              ppRVar4[i]->edges[j][0] = *data->graph->edges[uVar2];
              ppRVar4[i]->edges[j][1] = data->graph->edges[uVar2][1];
              j = j + 1;
            }
          }
          i = i + 1;
          currEdge = currEdge + 1;
        }
      }
    }
    *ptr = ppRVar4;
    data_local._4_4_ = currFam;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getRCPrototypes(const RDL_data *data, RDL_cycle ***ptr)
{
  RDL_cycle **result;
  unsigned nof_urf;
  unsigned nofRel=0, rcf=0;
  unsigned currFam=0, currEdge;
  unsigned i,j,k;
  const char* prototype;
  unsigned bcc_index, mapped_edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    for (j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      nofRel += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
  }

  /*allocate space*/
  result = malloc(nofRel * sizeof(*result));

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    nof_urf = data->nofURFsPerBCC[bcc_index];
    for (i = 0; i < nof_urf; ++i) {
      for (j = 0; j < data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i]; ++j, ++rcf) {
        prototype = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->prototype;
        result[currFam] = malloc(sizeof(**result));
        result[currFam]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight *
                                  sizeof(*result[currFam]->edges));
        result[currFam]->weight = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight;
        result[currFam]->urf = i;
        result[currFam]->rcf = rcf;
        currEdge = 0;
        for (k = 0; k < data->bccGraphs->bcc_graphs[bcc_index]->E; ++k) {
          if (prototype[k] == 1) {
            mapped_edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][k];
            result[currFam]->edges[currEdge][0] = data->graph->edges[mapped_edge][0];
            result[currFam]->edges[currEdge][1] = data->graph->edges[mapped_edge][1];
            ++currEdge;
          }
        }
        ++currFam;
      }
    }
  }

  (*ptr) = result;
  return nofRel;
}